

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall DPlayerMenu::MouseEvent(DPlayerMenu *this,int type,int x,int y)

{
  int iVar1;
  uint uVar2;
  uint32 uVar3;
  uint32 color_2;
  uint32 color_1;
  uint32 color;
  FName current;
  bool res;
  FListMenuItem *li;
  int v;
  int y_local;
  int x_local;
  int type_local;
  DPlayerMenu *this_local;
  
  _current = (this->super_DListMenu).mFocusControl;
  li._4_4_ = y;
  v = x;
  y_local = type;
  _x_local = this;
  color._3_1_ = DListMenu::MouseEvent(&this->super_DListMenu,type,x,y);
  if (_current == (FListMenuItem *)0x0) {
    _current = (this->super_DListMenu).mFocusControl;
  }
  if (_current != (FListMenuItem *)0x0) {
    (*_current->_vptr_FListMenuItem[7])((FName *)&color_1,_current,0);
    iVar1 = FName::operator_cast_to_int((FName *)&color_1);
    if (iVar1 == 0x205) {
      uVar2 = (*_current->_vptr_FListMenuItem[0xb])(_current,0,&li);
      if ((uVar2 & 1) != 0) {
        uVar3 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
        SendNewColor(this,(int)li,uVar3 >> 8 & 0xff,uVar3 & 0xff);
      }
    }
    else if (iVar1 == 0x206) {
      uVar2 = (*_current->_vptr_FListMenuItem[0xb])(_current,0,&li);
      if ((uVar2 & 1) != 0) {
        uVar3 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
        SendNewColor(this,uVar3 >> 0x10 & 0xff,(int)li,uVar3 & 0xff);
      }
    }
    else if ((iVar1 == 0x207) &&
            (uVar2 = (*_current->_vptr_FListMenuItem[0xb])(_current,0,&li), (uVar2 & 1) != 0)) {
      uVar3 = userinfo_t::GetColor((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
      SendNewColor(this,uVar3 >> 0x10 & 0xff,uVar3 >> 8 & 0xff,(int)li);
    }
  }
  return (bool)(color._3_1_ & 1);
}

Assistant:

bool DPlayerMenu::MouseEvent(int type, int x, int y)
{
	int v;
	FListMenuItem *li = mFocusControl;
	bool res = Super::MouseEvent(type, x, y);
	if (li == NULL) li = mFocusControl;
	if (li != NULL)
	{
		// Check if the colors have changed
		FName current = li->GetAction(NULL);
		switch(current)
		{
		case NAME_Red:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (v, GPART(color), BPART(color));
			}
			break;

		case NAME_Green:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (RPART(color), v, BPART(color));
			}
			break;

		case NAME_Blue:
			if (li->GetValue(0, &v))
			{
				uint32 color = players[consoleplayer].userinfo.GetColor();
				SendNewColor (RPART(color), GPART(color), v);
			}
			break;
		}
	}
	return res;
}